

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::PathTypeHandlerWithAttr::PathTypeHandlerWithAttr
          (PathTypeHandlerWithAttr *this,TypePath *typePath,ObjectSlotAttributes *attributes,
          PathTypeSetterSlotIndex *setters,PathTypeSetterSlotIndex setterCount,uint16 pathLength,
          PropertyIndex slotCapacity,uint16 inlineSlotCapacity,uint16 offsetOfInlineSlots,
          bool isLocked,bool isShared,DynamicType *predecessorType)

{
  bool isShared_local;
  bool isLocked_local;
  uint16 pathLength_local;
  PathTypeSetterSlotIndex setterCount_local;
  PathTypeSetterSlotIndex *setters_local;
  ObjectSlotAttributes *attributes_local;
  TypePath *typePath_local;
  PathTypeHandlerWithAttr *this_local;
  
  PathTypeHandlerNoAttr::PathTypeHandlerNoAttr
            (&this->super_PathTypeHandlerNoAttr,typePath,pathLength,slotCapacity,inlineSlotCapacity,
             offsetOfInlineSlots,isLocked,isShared,predecessorType);
  (this->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.super_DynamicTypeHandler.
  _vptr_DynamicTypeHandler = (_func_int **)&PTR_GetCppName_01e48c38;
  Memory::WriteBarrierPtr<Js::ObjectSlotAttributes>::WriteBarrierPtr(&this->attributes,attributes);
  Memory::WriteBarrierPtr<unsigned_char>::WriteBarrierPtr(&this->setters,setters);
  this->setterCount = setterCount;
  return;
}

Assistant:

PathTypeHandlerWithAttr::PathTypeHandlerWithAttr(TypePath *typePath, ObjectSlotAttributes * attributes, PathTypeSetterSlotIndex * setters, PathTypeSetterSlotIndex setterCount, uint16 pathLength, const PropertyIndex slotCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots, bool isLocked, bool isShared, DynamicType* predecessorType) :
        PathTypeHandlerNoAttr(typePath, pathLength, slotCapacity, inlineSlotCapacity, offsetOfInlineSlots, isLocked, isShared, predecessorType),
        attributes(attributes),
        setters(setters),
        setterCount(setterCount)
    {
    }